

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O0

void __thiscall iDynTree::MatrixFixSize<6U,_6U>::zero(MatrixFixSize<6U,_6U> *this)

{
  size_t sVar1;
  MatrixFixSize<6U,_6U> *in_RDI;
  size_t col;
  size_t row;
  ulong local_18;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = rows(in_RDI);
    if (sVar1 <= local_10) break;
    local_18 = 0;
    while( true ) {
      sVar1 = cols(in_RDI);
      if (sVar1 <= local_18) break;
      sVar1 = rawIndexRowMajor(in_RDI,local_10,local_18);
      in_RDI->m_data[sVar1] = 0.0;
      local_18 = local_18 + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void MatrixFixSize<nRows,nCols>::zero()
    {
        for(std::size_t row=0; row < this->rows(); row++ )
        {
            for(std::size_t col=0; col < this->cols(); col++ )
            {
                this->m_data[rawIndexRowMajor(row,col)] = 0.0;
            }
        }
    }